

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> __thiscall
qclab::dense::init_unique_array<std::complex<float>>(dense *this,int64_t size,complex<float> value)

{
  pointer __first;
  pointer pcVar1;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> local_28;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> mem;
  int64_t size_local;
  complex<float> value_local;
  
  mem._M_t.super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
  _M_t.super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )(__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
         )size;
  value_local._M_value = (_ComplexT)this;
  alloc_unique_array<std::complex<float>>((dense *)&local_28,size);
  __first = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::get
                      (&local_28);
  pcVar1 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::get
                     (&local_28);
  std::fill<std::complex<float>*,std::complex<float>>
            (__first,pcVar1 + (long)mem._M_t.
                                    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                    .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                    _M_head_impl,(complex<float> *)&size_local);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)this,
             &local_28);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_28);
  return (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
          )(__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
            )this;
}

Assistant:

inline auto init_unique_array( const int64_t size , const T value ) {
      auto mem = alloc_unique_array< T >( size ) ;
      std::fill( mem.get() , mem.get() + size , value ) ;
      return mem ;
    }